

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicCounter.h
# Opt level: O2

void __thiscall aeron::concurrent::AtomicCounter::~AtomicCounter(AtomicCounter *this)

{
  CountersManager *this_00;
  
  this->_vptr_AtomicCounter = (_func_int **)&PTR__AtomicCounter_00170b30;
  this_00 = (this->m_countersManager).
            super___shared_ptr<aeron::concurrent::CountersManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 != (CountersManager *)0x0) {
    CountersManager::free(this_00,(void *)(ulong)(uint)this->m_counterId);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_countersManager).
              super___shared_ptr<aeron::concurrent::CountersManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

virtual ~AtomicCounter()
    {
        if (nullptr != m_countersManager)
        {
            m_countersManager->free(m_counterId);
        }
    }